

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O1

void xml_error_strings(TidyDoc tdoc)

{
  uint messageType;
  ctmbstr ptVar1;
  ctmbstr ptVar2;
  TidyIterator j;
  TidyIterator local_38;
  
  local_38 = getErrorCodeList();
  puts("<?xml version=\"1.0\"?>");
  ptVar1 = tidyLibraryVersion();
  printf("<error_strings version=\"%s\">\n",ptVar1);
  while (local_38 != (TidyIterator)0x0) {
    messageType = getNextErrorCode(&local_38);
    ptVar1 = tidyLocalizedString(messageType);
    puts(" <error_string>");
    ptVar2 = tidyErrorCodeAsKey(messageType);
    printf("  <name>%s</name>\n",ptVar2);
    ptVar2 = tidyGetLanguage();
    if (ptVar1 == (ctmbstr)0x0) {
      printf("  <string class=\"%s\">NULL</string>\n",ptVar2);
    }
    else {
      printf("  <string class=\"%s\"><![CDATA[%s]]></string>\n",ptVar2,ptVar1);
    }
    puts(" </error_string>");
  }
  puts("</error_strings>");
  return;
}

Assistant:

static void xml_error_strings( TidyDoc tdoc )
{
    uint errorCode;
    ctmbstr localizedString;
    TidyIterator j = getErrorCodeList();

    printf( "<?xml version=\"1.0\"?>\n" );
    printf( "<error_strings version=\"%s\">\n", tidyLibraryVersion());

    while (j) {
        errorCode = getNextErrorCode(&j);
        localizedString = tidyLocalizedString(errorCode);
        printf( " <error_string>\n" );
        printf( "  <name>%s</name>\n", tidyErrorCodeAsKey(errorCode));
        if ( localizedString )
            printf( "  <string class=\"%s\"><![CDATA[%s]]></string>\n", tidyGetLanguage(), localizedString );
        else
            printf( "  <string class=\"%s\">NULL</string>\n", tidyGetLanguage() );

        printf( " </error_string>\n" );
    }
    
    printf( "</error_strings>\n" );
}